

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec.c
# Opt level: O0

size_t ecAddMulA_deep(size_t n,size_t ec_d,size_t ec_deep,size_t k,...)

{
  char in_AL;
  ulong in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  size_t naf_count;
  size_t naf_width;
  size_t m;
  va_list marker;
  size_t ret;
  size_t i;
  long *local_130;
  undefined1 local_118 [32];
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  long local_60;
  size_t local_58;
  long local_50;
  uint local_48;
  undefined4 local_44;
  long *local_40;
  undefined1 *local_38;
  long local_30;
  ulong local_28;
  ulong local_20;
  long local_18;
  long local_10;
  long local_8;
  
  if (in_AL != '\0') {
    local_e8 = in_XMM0_Qa;
    local_d8 = in_XMM1_Qa;
    local_c8 = in_XMM2_Qa;
    local_b8 = in_XMM3_Qa;
    local_a8 = in_XMM4_Qa;
    local_98 = in_XMM5_Qa;
    local_88 = in_XMM6_Qa;
    local_78 = in_XMM7_Qa;
  }
  local_30 = in_RCX * 0x30 + in_RSI * in_RDI * 8;
  local_38 = local_118;
  local_40 = (long *)&stack0x00000008;
  local_44 = 0x30;
  local_48 = 0x20;
  local_f8 = in_R8;
  local_f0 = in_R9;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_28 = 0; local_28 < local_20; local_28 = local_28 + 1) {
    if (local_48 < 0x29) {
      local_130 = (long *)(local_38 + (int)local_48);
      local_48 = local_48 + 8;
    }
    else {
      local_130 = local_40;
      local_40 = local_40 + 1;
    }
    local_50 = *local_130;
    local_58 = ecNAFWidth(local_50 << 6);
    local_60 = 1L << ((char)local_58 - 2U & 0x3f);
    local_30 = local_10 * local_8 * local_60 * 8 + (local_50 * 2 + 1) * 8 + local_30;
  }
  return local_30 + local_18;
}

Assistant:

size_t ecAddMulA_deep(size_t n, size_t ec_d, size_t ec_deep, size_t k, ...)
{
	size_t i, ret;
	va_list marker;
	ret = O_OF_W(ec_d * n);
	ret += 4 * sizeof(size_t) * k;
	ret += 2 * sizeof(word**) * k;
	va_start(marker, k);
	for (i = 0; i < k; ++i)
	{
		size_t m = va_arg(marker, size_t);
		size_t naf_width = ecNAFWidth(B_OF_W(m));
		size_t naf_count = SIZE_1 << (naf_width - 2);
		ret += O_OF_W(2 * m + 1);
		ret += O_OF_W(ec_d * n * naf_count);
	}
	va_end(marker);
	ret += ec_deep;
	return ret;
}